

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::anon_unknown_79::Parser::parseValue(Parser *this,Builder *output)

{
  Input *this_00;
  size_t *psVar1;
  byte *pbVar2;
  char *value;
  undefined2 *puVar3;
  double dVar4;
  long lVar5;
  Builder builder;
  Builder builder_00;
  byte bVar6;
  char cVar7;
  ulong uVar8;
  Fault FVar9;
  Array<char> *this_01;
  long lVar10;
  unsigned_long i;
  long lVar11;
  bool bVar12;
  Reader value_00;
  ArrayPtr<const_char> expected;
  ArrayPtr<const_char> expected_00;
  ArrayPtr<const_char> expected_01;
  Reader value_01;
  Fault f;
  int local_e0;
  undefined4 uStack_dc;
  ArrayDisposer *local_d8;
  WirePointer *local_d0;
  DebugExpression<bool> _kjCondition_1;
  undefined7 uStack_b7;
  DebugExpression<bool> _kjCondition;
  uint7 uStack_97;
  RemoveConst<capnp::Orphan<capnp::json::Value>_> *pRStack_90;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:650:5)>
  _kjDefer650;
  Orphanage orphanage;
  Orphan<capnp::json::Value::Field> orphan;
  
  this_00 = &this->input;
  Input::consumeWhitespace(this_00);
  _kjDefer650.maybeFunc.ptr.isSet = true;
  _kjDefer650.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:650:5)>_2
        )this;
  if ((this->input).wrapped.size_ == 0) {
    __kjCondition = (Exception *)((ulong)uStack_97 << 8);
LAB_00167ae2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x28c,FAILED,"!input.exhausted()","_kjCondition,\"JSON message ends prematurely.\"",
               &_kjCondition,(char (*) [31])"JSON message ends prematurely.");
    kj::_::Debug::Fault::fatal(&f);
  }
  bVar12 = *(this_00->wrapped).ptr == '\0';
  _kjCondition.value = !bVar12;
  if (bVar12) goto LAB_00167ae2;
  bVar6 = Input::nextChar(this_00);
  if (bVar6 - 0x30 < 10) {
LAB_00167468:
    value = (this_00->wrapped).ptr;
    Input::tryConsume(this_00,'-');
    bVar12 = Input::tryConsume(this_00,'0');
    if (!bVar12) {
      cVar7 = Input::nextChar(this_00);
      bVar12 = (byte)(cVar7 - 0x31U) < 9;
      _kjCondition_1.value = bVar12;
      if (!bVar12) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[34]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x25c,FAILED,"predicate(current)",
                   "_kjCondition,\"Unexpected input in JSON message.\"",&_kjCondition_1,
                   (char (*) [34])"Unexpected input in JSON message.");
        kj::_::Debug::Fault::fatal(&f);
      }
      Input::advance(this_00,1);
      while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
             (cVar7 = Input::nextChar(this_00), (byte)(cVar7 - 0x30U) < 10))) {
        Input::advance(this_00,1);
      }
    }
    bVar12 = Input::tryConsume(this_00,'.');
    if (bVar12 && (this->input).wrapped.size_ != 0) {
      do {
        if ((*(this_00->wrapped).ptr == '\0') ||
           (cVar7 = Input::nextChar(this_00), 9 < (byte)(cVar7 - 0x30U))) break;
        Input::advance(this_00,1);
      } while ((this->input).wrapped.size_ != 0);
    }
    bVar12 = Input::tryConsume(this_00,'e');
    if ((bVar12) || (bVar12 = Input::tryConsume(this_00,'E'), bVar12)) {
      bVar12 = Input::tryConsume(this_00,'+');
      if (!bVar12) {
        Input::tryConsume(this_00,'-');
      }
      while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
             (cVar7 = Input::nextChar(this_00), (byte)(cVar7 - 0x30U) < 10))) {
        Input::advance(this_00,1);
      }
    }
    f.exception = (Exception *)((this_00->wrapped).ptr + -(long)value);
    if (f.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                ((Fault *)&_kjCondition_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x33d,FAILED,"numArrayPtr.size() > 0",
                 "_kjCondition,\"Expected number in JSON input.\"",
                 (DebugComparison<unsigned_long,_int> *)&f,
                 (char (*) [31])"Expected number in JSON input.");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
    }
    kj::heapString((String *)&_kjCondition,value,(size_t)f.exception);
    dVar4 = kj::String::parseAs<double>((String *)&_kjCondition);
    puVar3 = (undefined2 *)(output->_builder).data;
    *puVar3 = 2;
    *(double *)(puVar3 + 4) = dVar4;
    this_01 = (Array<char> *)&_kjCondition;
  }
  else {
    if (bVar6 != 0x22) {
      if (bVar6 != 0x2d) {
        if (bVar6 == 0x5b) {
          __kjCondition = (Exception *)0x0;
          builder_00._builder.capTable = (CapTableBuilder *)f.exception;
          builder_00._builder.segment = (SegmentBuilder *)output;
          builder_00._builder.data._0_4_ = local_e0;
          builder_00._builder.data._4_4_ = uStack_dc;
          builder_00._builder.pointers = (WirePointer *)local_d8;
          builder_00._builder._32_8_ = local_d0;
          orphan.builder._0_16_ =
               Orphanage::getForMessageContaining<capnp::json::Value::Builder>(builder_00);
          Input::consume(this_00,'[');
          psVar1 = &this->nestingDepth;
          uVar8 = this->nestingDepth + 1;
          this->nestingDepth = uVar8;
          f.exception = (Exception *)psVar1;
          if (this->maxNestingDepth < uVar8) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long_const&>&,char_const(&)[32]>
                      ((Fault *)&_kjCondition_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x2ad,FAILED,"++nestingDepth <= maxNestingDepth",
                       "_kjCondition,\"JSON message nested too deeply.\"",
                       (DebugComparison<unsigned_long_&,_const_unsigned_long_&> *)&f,
                       (char (*) [32])"JSON message nested too deeply.");
            kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
          }
          bVar12 = false;
          while( true ) {
            Input::consumeWhitespace(this_00);
            cVar7 = Input::nextChar(this_00);
            if (cVar7 == ']') break;
            Orphanage::newOrphan<capnp::json::Value>
                      ((Orphan<capnp::json::Value> *)&_kjCondition_1,(Orphanage *)&orphan);
            capnp::_::OrphanGetImpl<capnp::json::Value,_(capnp::Kind)3>::apply
                      ((Builder *)&f,(OrphanBuilder *)&_kjCondition_1);
            if (bVar12) {
              Input::consumeWhitespace(this_00);
              Input::consume(this_00,',');
              Input::consumeWhitespace(this_00);
            }
            parseValue(this,(Builder *)&f);
            kj::Vector<capnp::Orphan<capnp::json::Value>>::add<capnp::Orphan<capnp::json::Value>>
                      ((Vector<capnp::Orphan<capnp::json::Value>> *)&_kjCondition,
                       (Orphan<capnp::json::Value> *)&_kjCondition_1);
            capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&_kjCondition_1);
            bVar12 = true;
          }
          json::Value::Builder::initArray
                    ((Builder *)&f,output,(uint)((ulong)-(long)__kjCondition >> 5));
          json::Value::Builder::getArray((Builder *)&f,output);
          lVar5 = -(long)__kjCondition;
          lVar10 = 0;
          for (lVar11 = 0; lVar5 >> 5 != lVar11; lVar11 = lVar11 + 1) {
            List<capnp::json::Value,_(capnp::Kind)3>::Builder::adoptWithCaveats
                      ((Builder *)&f,(uint)lVar11,
                       (Orphan<capnp::json::Value> *)((long)__kjCondition->trace + lVar10 + -0x68));
            lVar10 = lVar10 + 0x20;
          }
          Input::consume(this_00,']');
          *psVar1 = *psVar1 - 1;
          kj::ArrayBuilder<capnp::Orphan<capnp::json::Value>_>::dispose
                    ((ArrayBuilder<capnp::Orphan<capnp::json::Value>_> *)&_kjCondition);
        }
        else if (bVar6 == 0x66) {
          expected.size_ = 5;
          expected.ptr = "false";
          Input::consume(this_00,expected);
          puVar3 = (undefined2 *)(output->_builder).data;
          *puVar3 = 1;
          pbVar2 = (byte *)(puVar3 + 1);
          *pbVar2 = *pbVar2 & 0xfe;
        }
        else if (bVar6 == 0x6e) {
          expected_00.size_ = 4;
          expected_00.ptr = "null";
          Input::consume(this_00,expected_00);
          *(undefined2 *)(output->_builder).data = 0;
        }
        else if (bVar6 == 0x74) {
          expected_01.size_ = 4;
          expected_01.ptr = "true";
          Input::consume(this_00,expected_01);
          puVar3 = (undefined2 *)(output->_builder).data;
          *puVar3 = 1;
          pbVar2 = (byte *)(puVar3 + 1);
          *pbVar2 = *pbVar2 | 1;
        }
        else {
          if (bVar6 != 0x7b) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x298,FAILED,(char *)0x0,"\"Unexpected input in JSON message.\"",
                       (char (*) [34])"Unexpected input in JSON message.");
            kj::_::Debug::Fault::fatal(&f);
          }
          __kjCondition_1 = 0;
          builder._builder.capTable = (CapTableBuilder *)f.exception;
          builder._builder.segment = (SegmentBuilder *)output;
          builder._builder.data._0_4_ = local_e0;
          builder._builder.data._4_4_ = uStack_dc;
          builder._builder.pointers = (WirePointer *)local_d8;
          builder._builder._32_8_ = local_d0;
          orphanage = Orphanage::getForMessageContaining<capnp::json::Value::Builder>(builder);
          Input::consume(this_00,'{');
          psVar1 = &this->nestingDepth;
          uVar8 = this->nestingDepth + 1;
          this->nestingDepth = uVar8;
          f.exception = (Exception *)psVar1;
          if (this->maxNestingDepth < uVar8) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long_const&>&,char_const(&)[32]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x2d0,FAILED,"++nestingDepth <= maxNestingDepth",
                       "_kjCondition,\"JSON message nested too deeply.\"",
                       (DebugComparison<unsigned_long_&,_const_unsigned_long_&> *)&f,
                       (char (*) [32])"JSON message nested too deeply.");
            kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
          }
          bVar12 = false;
          while( true ) {
            Input::consumeWhitespace(this_00);
            cVar7 = Input::nextChar(this_00);
            if (cVar7 == '}') break;
            Orphanage::newOrphan<capnp::json::Value::Field>
                      ((Orphan<capnp::json::Value::Field> *)&orphan.builder,&orphanage);
            capnp::_::OrphanGetImpl<capnp::json::Value::Field,_(capnp::Kind)3>::apply
                      ((Builder *)&f,&orphan.builder);
            if (bVar12) {
              Input::consumeWhitespace(this_00);
              Input::consume(this_00,',');
              Input::consumeWhitespace(this_00);
            }
            consumeQuotedString((String *)&_kjCondition,this);
            FVar9.exception = (Exception *)0x20b013;
            if (pRStack_90 != (RemoveConst<capnp::Orphan<capnp::json::Value>_> *)0x0) {
              FVar9.exception = __kjCondition;
            }
            value_00.super_StringPtr.content.size_ =
                 (long)&(pRStack_90->builder).tag.content +
                 (ulong)(pRStack_90 == (RemoveConst<capnp::Orphan<capnp::json::Value>_> *)0x0);
            value_00.super_StringPtr.content.ptr = (char *)FVar9.exception;
            json::Value::Field::Builder::setName((Builder *)&f,value_00);
            kj::Array<char>::~Array((Array<char> *)&_kjCondition);
            Input::consumeWhitespace(this_00);
            Input::consume(this_00,':');
            Input::consumeWhitespace(this_00);
            json::Value::Field::Builder::getValue((Builder *)&_kjCondition,(Builder *)&f);
            parseValue(this,(Builder *)&_kjCondition);
            kj::Vector<capnp::Orphan<capnp::json::Value::Field>>::
            add<capnp::Orphan<capnp::json::Value::Field>>
                      ((Vector<capnp::Orphan<capnp::json::Value::Field>> *)&_kjCondition_1,
                       (Orphan<capnp::json::Value::Field> *)&orphan.builder);
            capnp::_::OrphanBuilder::~OrphanBuilder(&orphan.builder);
            bVar12 = true;
          }
          json::Value::Builder::initObject((Builder *)&f,output,(uint)(-__kjCondition_1 >> 5));
          json::Value::Builder::getObject((Builder *)&f,output);
          lVar5 = -__kjCondition_1;
          lVar10 = 0;
          for (lVar11 = 0; lVar5 >> 5 != lVar11; lVar11 = lVar11 + 1) {
            List<capnp::json::Value::Field,_(capnp::Kind)3>::Builder::adoptWithCaveats
                      ((Builder *)&f,(uint)lVar11,
                       (Orphan<capnp::json::Value::Field> *)(__kjCondition_1 + lVar10));
            lVar10 = lVar10 + 0x20;
          }
          Input::consume(this_00,'}');
          *psVar1 = *psVar1 - 1;
          kj::ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_>::dispose
                    ((ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_> *)&_kjCondition_1);
        }
        goto LAB_00167598;
      }
      goto LAB_00167468;
    }
    consumeQuotedString((String *)&f,this);
    lVar5 = CONCAT44(uStack_dc,local_e0);
    FVar9 = f;
    if (lVar5 == 0) {
      FVar9.exception = (Exception *)0x20b013;
    }
    value_01.super_StringPtr.content.size_ = lVar5 + (ulong)(lVar5 == 0);
    value_01.super_StringPtr.content.ptr = (char *)FVar9.exception;
    json::Value::Builder::setString(output,value_01);
    this_01 = (Array<char> *)&f;
  }
  kj::Array<char>::~Array(this_01);
LAB_00167598:
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++:650:5)>
  ::~Deferred(&_kjDefer650);
  return;
}

Assistant:

void parseValue(JsonValue::Builder& output) {
    input.consumeWhitespace();
    KJ_DEFER(input.consumeWhitespace());

    KJ_REQUIRE(!input.exhausted(), "JSON message ends prematurely.");

    switch (input.nextChar()) {
      case 'n': input.consume("null"_kj);  output.setNull();         break;
      case 'f': input.consume("false"_kj); output.setBoolean(false); break;
      case 't': input.consume("true"_kj);  output.setBoolean(true);  break;
      case '"': parseString(output); break;
      case '[': parseArray(output);  break;
      case '{': parseObject(output); break;
      case '-': case '0': case '1': case '2': case '3':
      case '4': case '5': case '6': case '7': case '8':
      case '9': parseNumber(output); break;
      default: KJ_FAIL_REQUIRE("Unexpected input in JSON message.");
    }
  }